

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

void __thiscall Bracket::Bracket(Bracket *this)

{
  Bracket *this_local;
  
  Atom::Atom(&this->super_Atom);
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Bracket_00112c00;
  std::__cxx11::string::string((string *)&this->func);
  std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::list(&this->para);
  return;
}

Assistant:

Bracket::Bracket() {}